

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  string *psVar7;
  bool bVar8;
  uint uVar9;
  bool bVar10;
  WeightParamType WVar11;
  WeightParams *pWVar12;
  long *plVar13;
  LayerUnion LVar14;
  uint uVar15;
  size_type *psVar16;
  Result *_result;
  char cVar17;
  bool bVar18;
  bool bVar19;
  string err;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint64 local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar10 = Result::good(__return_storage_ptr__);
  if (!bVar10) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar10) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar10 = Result::good(__return_storage_ptr__);
  if (!bVar10) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar10) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Batchnorm","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar10 = Result::good(__return_storage_ptr__);
    if (!bVar10) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar10) {
      return __return_storage_ptr__;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Batchnorm","");
    validateRankCount(__return_storage_ptr__,layer,&local_98,3,-1,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar10 = Result::good(__return_storage_ptr__);
    if (!bVar10) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar10) {
      return __return_storage_ptr__;
    }
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    LVar14 = layer->layer_;
  }
  else {
    LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
  }
  pWVar12 = (WeightParams *)((LVar14.activation_)->NonlinearityType_).relu_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar2 = (pWVar12->floatvalue_).current_size_;
  uVar15 = (0 < iVar2) + 1;
  if (((pWVar12->float16value_).ptr_)->_M_string_length == 0) {
    uVar15 = (uint)(0 < iVar2);
  }
  if ((iVar2 < 1) ||
     (((uVar15 - (((pWVar12->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
      (uint)(((pWVar12->int8rawvalue_).ptr_)->_M_string_length == 0) != 1)) {
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.innerproduct_)->bias_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar12->floatvalue_).current_size_;
    uVar15 = (0 < iVar2) + 1;
    if (((pWVar12->float16value_).ptr_)->_M_string_length == 0) {
      uVar15 = (uint)(0 < iVar2);
    }
    if ((0 < iVar2) &&
       (((uVar15 - (((pWVar12->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
        (uint)(((pWVar12->int8rawvalue_).ptr_)->_M_string_length == 0) == 1)) goto LAB_00305b2b;
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.batchnorm_)->mean_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar12->floatvalue_).current_size_;
    uVar15 = (0 < iVar2) + 1;
    if (((pWVar12->float16value_).ptr_)->_M_string_length == 0) {
      uVar15 = (uint)(0 < iVar2);
    }
    if ((0 < iVar2) &&
       (((uVar15 - (((pWVar12->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
        (uint)(((pWVar12->int8rawvalue_).ptr_)->_M_string_length == 0) == 1)) goto LAB_00305b2b;
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.batchnorm_)->variance_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar12->floatvalue_).current_size_;
    uVar15 = (0 < iVar2) + 1;
    if (((pWVar12->float16value_).ptr_)->_M_string_length == 0) {
      uVar15 = (uint)(0 < iVar2);
    }
    uVar9 = (uint)(((pWVar12->int8rawvalue_).ptr_)->_M_string_length == 0);
    uVar15 = (uVar15 - (((pWVar12->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
    bVar10 = true;
    if (uVar15 - uVar9 < 2) {
      bVar10 = uVar15 == uVar9 || iVar2 < 1;
    }
  }
  else {
LAB_00305b2b:
    bVar10 = false;
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    LVar14 = layer->layer_;
  }
  else {
    LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
  }
  pWVar12 = (WeightParams *)((LVar14.activation_)->NonlinearityType_).relu_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar2 = (pWVar12->floatvalue_).current_size_;
  sVar4 = ((pWVar12->float16value_).ptr_)->_M_string_length;
  uVar15 = (0 < iVar2) + 1;
  if (sVar4 == 0) {
    uVar15 = (uint)(0 < iVar2);
  }
  sVar5 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
  sVar6 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
  uVar9 = (uint)(sVar6 == 0);
  uVar15 = (uVar15 - (sVar5 == 0)) + 2;
  cVar17 = '\x04';
  if (uVar15 - uVar9 < 2) {
    cVar17 = '\x05';
    if (uVar15 != uVar9) {
      cVar17 = iVar2 < 1;
    }
    if (((((sVar4 == 0) && (iVar2 < 1)) && (uVar15 != uVar9)) &&
        (((sVar5 == 0 ||
          (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
         (cVar17 = '\x02', pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar6 == 0 || (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)
         ) || (cVar17 = '\x03', pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
      cVar17 = '\x05';
    }
  }
  if (cVar17 == '\x01') {
LAB_00305d88:
    bVar18 = false;
  }
  else {
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.innerproduct_)->bias_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar12->floatvalue_).current_size_;
    sVar4 = ((pWVar12->float16value_).ptr_)->_M_string_length;
    uVar15 = (0 < iVar2) + 1;
    if (sVar4 == 0) {
      uVar15 = (uint)(0 < iVar2);
    }
    sVar5 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
    sVar6 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
    uVar9 = (uint)(sVar6 == 0);
    uVar15 = (uVar15 - (sVar5 == 0)) + 2;
    cVar17 = '\x04';
    if (uVar15 - uVar9 < 2) {
      cVar17 = '\x05';
      if (uVar15 != uVar9) {
        cVar17 = iVar2 < 1;
      }
      if (((((sVar4 == 0) && (iVar2 < 1)) && (uVar15 != uVar9)) &&
          (((sVar5 == 0 ||
            (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (cVar17 = '\x02', pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar6 == 0 ||
           (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (cVar17 = '\x03', pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
        cVar17 = '\x05';
      }
    }
    if (cVar17 == '\x01') goto LAB_00305d88;
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.batchnorm_)->mean_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar12->floatvalue_).current_size_;
    sVar4 = ((pWVar12->float16value_).ptr_)->_M_string_length;
    uVar15 = (0 < iVar2) + 1;
    if (sVar4 == 0) {
      uVar15 = (uint)(0 < iVar2);
    }
    sVar5 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
    sVar6 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
    uVar9 = (uint)(sVar6 == 0);
    uVar15 = (uVar15 - (sVar5 == 0)) + 2;
    cVar17 = '\x04';
    if (uVar15 - uVar9 < 2) {
      cVar17 = '\x05';
      if (uVar15 != uVar9) {
        cVar17 = iVar2 < 1;
      }
      if ((((sVar4 == 0) && (iVar2 < 1)) && (uVar15 != uVar9)) &&
         ((((sVar5 == 0 ||
            (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (cVar17 = '\x02', pWVar12->quantization_ == (QuantizationParams *)0x0)) &&
          (((sVar6 == 0 ||
            (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (cVar17 = '\x03', pWVar12->quantization_ == (QuantizationParams *)0x0)))))) {
        cVar17 = '\x05';
      }
    }
    if (cVar17 == '\x01') goto LAB_00305d88;
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.batchnorm_)->variance_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar11 = valueType(pWVar12);
    bVar18 = WVar11 != FLOAT16;
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    LVar14 = layer->layer_;
  }
  else {
    LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
  }
  pWVar12 = (WeightParams *)((LVar14.activation_)->NonlinearityType_).relu_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  bVar19 = 0 < (pWVar12->floatvalue_).current_size_;
  uVar15 = bVar19 + 1;
  if (((pWVar12->float16value_).ptr_)->_M_string_length == 0) {
    uVar15 = (uint)bVar19;
  }
  bVar19 = true;
  if (((uVar15 - (((pWVar12->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
      (uint)(((pWVar12->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.innerproduct_)->bias_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    bVar8 = 0 < (pWVar12->floatvalue_).current_size_;
    uVar15 = bVar8 + 1;
    if (((pWVar12->float16value_).ptr_)->_M_string_length == 0) {
      uVar15 = (uint)bVar8;
    }
    if (((uVar15 - (((pWVar12->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
        (uint)(((pWVar12->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar14 = layer->layer_;
      }
      else {
        LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar12 = (LVar14.batchnorm_)->mean_;
      if (pWVar12 == (WeightParams *)0x0) {
        pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bVar8 = 0 < (pWVar12->floatvalue_).current_size_;
      uVar15 = bVar8 + 1;
      if (((pWVar12->float16value_).ptr_)->_M_string_length == 0) {
        uVar15 = (uint)bVar8;
      }
      if (((uVar15 - (((pWVar12->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
          (uint)(((pWVar12->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar12 = (LVar14.batchnorm_)->variance_;
        if (pWVar12 == (WeightParams *)0x0) {
          pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar11 = valueType(pWVar12);
        bVar19 = WVar11 == UNSPECIFIED;
      }
    }
  }
  if ((bVar19) || (!bVar10 && !bVar18)) {
    std::operator+(&local_78,"Batchnorm layer \'",(layer->name_).ptr_);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    psVar16 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_98.field_2._M_allocated_capacity = *psVar16;
      local_98.field_2._8_8_ = plVar13[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar16;
      local_98._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_98._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
  }
  else {
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    local_58 = (LVar14.batchnorm_)->channels_;
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (WeightParams *)((LVar14.activation_)->NonlinearityType_).linear_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
    psVar7 = (layer->name_).ptr_;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"gamma","");
    validateGeneralWeightParams
              (__return_storage_ptr__,pWVar12,local_58,1,&local_98,psVar7,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar10 = Result::good(__return_storage_ptr__);
    if (!bVar10) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.innerproduct_)->bias_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
    psVar7 = (layer->name_).ptr_;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"beta","");
    validateGeneralWeightParams
              (__return_storage_ptr__,pWVar12,local_58,1,&local_98,psVar7,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar10 = Result::good(__return_storage_ptr__);
    if (!bVar10) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    if ((LVar14.batchnorm_)->computemeanvar_ != false) {
LAB_0030630c:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar14 = layer->layer_;
    }
    else {
      LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar12 = (LVar14.batchnorm_)->mean_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar11 = valueType(pWVar12);
    if (WVar11 != EMPTY) {
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar14 = layer->layer_;
      }
      else {
        LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar12 = (LVar14.batchnorm_)->mean_;
      if (pWVar12 == (WeightParams *)0x0) {
        pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      WVar11 = valueType(pWVar12);
      if (WVar11 != EMPTY) {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar12 = (LVar14.batchnorm_)->mean_;
        if (pWVar12 == (WeightParams *)0x0) {
          pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
        psVar7 = (layer->name_).ptr_;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mean","");
        validateGeneralWeightParams
                  (__return_storage_ptr__,pWVar12,local_58,1,&local_98,psVar7,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        bVar10 = Result::good(__return_storage_ptr__);
        if (!bVar10) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar14 = layer->layer_;
        }
        else {
          LVar14.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar12 = (LVar14.batchnorm_)->variance_;
        if (pWVar12 == (WeightParams *)0x0) {
          pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
        psVar7 = (layer->name_).ptr_;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"variance","");
        validateGeneralWeightParams
                  (__return_storage_ptr__,pWVar12,local_58,1,&local_98,psVar7,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        bVar10 = Result::good(__return_storage_ptr__);
        if (!bVar10) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        goto LAB_0030630c;
      }
    }
    std::operator+(&local_78,"Batchnorm layer \'",(layer->name_).ptr_);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    psVar16 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_98.field_2._M_allocated_capacity = *psVar16;
      local_98.field_2._8_8_ = plVar13[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar16;
      local_98._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_98._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank));
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta"));

    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance"));
    }
    return Result();
}